

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O3

void nni_http_client_connect(nni_http_client *c,nni_aio *aio)

{
  _Bool _Var1;
  nni_aio *pnVar2;
  
  nni_aio_reset(aio);
  nni_mtx_lock(&c->mtx);
  _Var1 = nni_aio_start(aio,http_dial_cancel,c);
  if (_Var1) {
    nni_list_append(&c->aios,aio);
    pnVar2 = (nni_aio *)nni_list_first(&c->aios);
    if (pnVar2 == aio) {
      http_dial_start(c);
    }
  }
  nni_mtx_unlock(&c->mtx);
  return;
}

Assistant:

void
nni_http_client_connect(nni_http_client *c, nni_aio *aio)
{
	nni_aio_reset(aio);
	nni_mtx_lock(&c->mtx);
	if (!nni_aio_start(aio, http_dial_cancel, c)) {
		nni_mtx_unlock(&c->mtx);
		return;
	}
	nni_list_append(&c->aios, aio);
	if (nni_list_first(&c->aios) == aio) {
		http_dial_start(c);
	}
	nni_mtx_unlock(&c->mtx);
}